

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O0

StructBuilder * __thiscall
capnp::_::ListBuilder::getStructElement
          (StructBuilder *__return_storage_ptr__,ListBuilder *this,ElementCount index)

{
  bool bVar1;
  unsigned_long uVar2;
  Fault local_70;
  Fault f;
  ulong local_60;
  DebugExpression<unsigned_long> local_58;
  undefined1 local_50 [8];
  DebugComparison<unsigned_long,_unsigned_int> _kjCondition;
  byte *structData;
  unsigned_long indexBit;
  ElementCount index_local;
  ListBuilder *this_local;
  
  uVar2 = upgradeBound<unsigned_long,unsigned_int>(index);
  local_60 = uVar2 * this->step;
  _kjCondition._32_8_ = this->ptr + (local_60 >> 3);
  local_60 = local_60 & 7;
  local_58 = kj::_::DebugExpressionStart::operator<<
                       ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_60);
  f.exception._4_4_ = 0;
  kj::_::DebugExpression<unsigned_long>::operator==
            ((DebugComparison<unsigned_long,_unsigned_int> *)local_50,&local_58,
             (uint *)((long)&f.exception + 4));
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_50);
  if (!bVar1) {
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,unsigned_int>&>
              (&local_70,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
               ,0xc16,FAILED,"indexBit % BITS_PER_BYTE == ZERO * BITS","_kjCondition,",
               (DebugComparison<unsigned_long,_unsigned_int> *)local_50);
    kj::_::Debug::Fault::fatal(&local_70);
  }
  StructBuilder::StructBuilder
            (__return_storage_ptr__,this->segment,this->capTable,(void *)_kjCondition._32_8_,
             (WirePointer *)(_kjCondition._32_8_ + (ulong)(this->structDataSize >> 3)),
             this->structDataSize,this->structPointerCount);
  return __return_storage_ptr__;
}

Assistant:

StructBuilder ListBuilder::getStructElement(ElementCount index) {
  auto indexBit = upgradeBound<uint64_t>(index) * step;
  byte* structData = ptr + indexBit / BITS_PER_BYTE;
  KJ_DASSERT(indexBit % BITS_PER_BYTE == ZERO * BITS);
  return StructBuilder(segment, capTable, structData,
      reinterpret_cast<WirePointer*>(structData + structDataSize / BITS_PER_BYTE),
      structDataSize, structPointerCount);
}